

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

void __thiscall
ncnn::Yolov3DetectionOutput::qsort_descent_inplace
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *datas,int left,int right)

{
  float fVar1;
  pointer pBVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  pointer pBVar17;
  int iVar18;
  int iVar19;
  pointer pBVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  pointer pBVar24;
  long lVar25;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  do {
    fVar1 = (datas->
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            )._M_impl.super__Vector_impl_data._M_start[(left + right) / 2].score;
    iVar21 = left;
    iVar19 = right;
    while (iVar21 <= iVar19) {
      pBVar2 = (datas->
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar22 = (long)iVar21 + -1;
      pBVar17 = pBVar2 + (long)iVar21 + -1;
      do {
        iVar3 = iVar21;
        pBVar20 = pBVar17;
        lVar22 = lVar22 + 1;
        iVar18 = iVar3 + 1;
        pBVar17 = pBVar20 + 1;
        iVar21 = iVar18;
      } while (fVar1 < pBVar20[1].score);
      lVar25 = (long)iVar19 + 1;
      pBVar2 = pBVar2 + (long)iVar19 + 1;
      do {
        iVar4 = iVar19;
        pBVar24 = pBVar2;
        lVar25 = lVar25 + -1;
        iVar23 = iVar4 + -1;
        pBVar2 = pBVar24 + -1;
        iVar19 = iVar23;
      } while (pBVar24[-1].score <= fVar1 && fVar1 != pBVar24[-1].score);
      iVar21 = iVar3;
      iVar19 = iVar4;
      if (lVar22 <= lVar25) {
        fVar15 = pBVar17->score;
        fVar16 = pBVar17->xmin;
        uVar5 = pBVar20[1].ymin;
        uVar6 = pBVar20[1].xmax;
        uVar7 = pBVar20[1].ymax;
        fVar14 = pBVar20[1].area;
        iVar19 = pBVar20[1].label;
        fVar10 = pBVar2->score;
        fVar11 = pBVar2->xmin;
        fVar12 = pBVar24[-1].ymin;
        fVar13 = pBVar24[-1].xmax;
        fVar8 = pBVar24[-1].ymax;
        fVar9 = pBVar24[-1].area;
        iVar21 = pBVar24[-1].label;
        pBVar20[1].xmax = pBVar24[-1].xmax;
        pBVar20[1].ymax = fVar8;
        pBVar20[1].area = fVar9;
        pBVar20[1].label = iVar21;
        pBVar17->score = fVar10;
        pBVar17->xmin = fVar11;
        pBVar20[1].ymin = fVar12;
        pBVar20[1].xmax = fVar13;
        pBVar24[-1].xmax = (float)uVar6;
        pBVar24[-1].ymax = (float)uVar7;
        pBVar24[-1].area = fVar14;
        pBVar24[-1].label = iVar19;
        pBVar2->score = fVar15;
        pBVar2->xmin = fVar16;
        pBVar24[-1].ymin = (float)uVar5;
        pBVar24[-1].xmax = (float)uVar6;
        iVar21 = iVar18;
        iVar19 = iVar23;
      }
    }
    if (left < iVar19) {
      qsort_descent_inplace(this,datas,left,iVar19);
    }
    left = iVar21;
  } while (iVar21 < right);
  return;
}

Assistant:

void Yolov3DetectionOutput::qsort_descent_inplace(std::vector<BBoxRect>& datas, int left, int right) const
{
    int i = left;
    int j = right;
    float p = datas[(left + right) / 2].score;

    while (i <= j)
    {
        while (datas[i].score > p)
            i++;

        while (datas[j].score < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, left, j);

    if (i < right)
        qsort_descent_inplace(datas, i, right);
}